

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

bool __thiscall Lexer::ReadEvalString(Lexer *this,EvalString *eval,bool path,string *err)

{
  byte *pbVar1;
  char cVar2;
  EvalString *this_00;
  char *pcVar3;
  char *pcVar4;
  StringPiece local_140;
  StringPiece local_130;
  StringPiece local_120;
  StringPiece local_110;
  StringPiece local_100;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  StringPiece local_a8;
  StringPiece local_98 [2];
  allocator<char> local_71;
  string local_70;
  byte local_49;
  char *pcStack_48;
  uchar yych;
  char *start;
  char *q;
  char *p;
  string *err_local;
  EvalString *pEStack_20;
  bool path_local;
  EvalString *eval_local;
  Lexer *this_local;
  
  q = this->ofs_;
  p = (char *)err;
  err_local._7_1_ = path;
  pEStack_20 = eval;
  eval_local = (EvalString *)this;
LAB_002303e1:
  do {
    while( true ) {
      this_00 = pEStack_20;
      pcVar4 = q;
      pcStack_48 = q;
      local_49 = *q;
      if ((""[(int)(uint)local_49] & 0x10) == 0) break;
      do {
        pcVar3 = q + 1;
        local_49 = q[1];
        q = pcVar3;
      } while ((""[(int)(uint)local_49] & 0x10) != 0);
      StringPiece::StringPiece(local_98,pcVar4,(long)pcVar3 - (long)pcVar4);
      EvalString::AddText(this_00,local_98[0]);
    }
    if (local_49 < 0xe) {
      if (local_49 == 0) {
        this->last_token_ = q;
        q = q + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"unexpected EOF",&local_71);
        this_local._7_1_ = Error(this,&local_70,(string *)p);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator(&local_71);
      }
      else {
        if (local_49 < 0xb) goto LAB_00230587;
        local_49 = q[1];
        if (local_49 == '\n') {
          pcVar3 = q + 2;
          if ((err_local._7_1_ & 1) != 0) {
            pcVar3 = q;
          }
          q = pcVar3;
          local_49 = 10;
LAB_00230b0a:
          this->last_token_ = pcVar4;
          this->ofs_ = q;
          if ((err_local._7_1_ & 1) != 0) {
            EatWhitespace(this);
          }
          this_local._7_1_ = 1;
        }
        else {
          this->last_token_ = q;
          q = q + 1;
          DescribeLastError_abi_cxx11_(&local_c8,this);
          this_local._7_1_ = Error(this,&local_c8,(string *)p);
          std::__cxx11::string::~string((string *)&local_c8);
        }
      }
      goto LAB_00230b37;
    }
    if ((local_49 < 0x21) || (0x24 < local_49)) {
LAB_00230587:
      pcVar3 = q + 1;
      if (((err_local._7_1_ & 1) != 0) || (cVar2 = *q, q = pcVar3, cVar2 == '\n'))
      goto LAB_00230b0a;
      StringPiece::StringPiece(&local_a8,pcVar4,1);
      EvalString::AddText(this_00,local_a8);
      goto LAB_002303e1;
    }
    local_49 = q[1];
    pcVar3 = q + 1;
    if ((""[(int)(uint)local_49] & 0x40) == 0) {
      if (local_49 < 0x21) {
        if (local_49 < 0xd) {
          q = q + 1;
          if (local_49 != 10) goto LAB_00230777;
          do {
            pcVar4 = q + 1;
            pbVar1 = (byte *)(q + 1);
            q = pcVar4;
          } while ((""[(int)(uint)*pbVar1] & 0x20) != 0);
        }
        else if (local_49 < 0xe) {
          local_49 = q[2];
          q = q + 2;
          if (local_49 != 10) goto LAB_00230777;
          do {
            pcVar3 = q + 1;
            pcVar4 = q + 1;
            q = pcVar3;
          } while (*pcVar4 == ' ');
        }
        else {
          if (local_49 < 0x20) goto LAB_00230777;
          q = q + 2;
          StringPiece::StringPiece(&local_100," ",1);
          EvalString::AddText(this_00,local_100);
        }
      }
      else if (local_49 < 0x30) {
        if (local_49 != 0x24) goto LAB_00230777;
        q = q + 2;
        StringPiece::StringPiece(&local_110,"$",1);
        EvalString::AddText(this_00,local_110);
      }
      else if (local_49 < 0x3b) {
        q = q + 2;
        StringPiece::StringPiece(&local_130,":",1);
        EvalString::AddText(this_00,local_130);
      }
      else {
        if ((local_49 < 0x61) || (0x7b < local_49)) {
LAB_00230777:
          q = pcVar4 + 2;
          this->last_token_ = pcVar4;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"bad $-escape (literal $ must be written as $$)",&local_e9)
          ;
          this_local._7_1_ = Error(this,&local_e8,(string *)p);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator(&local_e9);
LAB_00230b37:
          return (bool)(this_local._7_1_ & 1);
        }
        start = q + 2;
        local_49 = q[2];
        pcVar3 = start;
        if ((""[(int)(uint)local_49] & 0x80) == 0) goto LAB_00230777;
        do {
          q = pcVar3;
          local_49 = q[1];
          pcVar3 = q + 1;
        } while ((""[(int)(uint)local_49] & 0x80) != 0);
        if (local_49 != 0x7d) goto LAB_00230777;
        q = q + 2;
        StringPiece::StringPiece(&local_140,pcVar4 + 2,(size_t)(q + (-3 - (long)pcVar4)));
        EvalString::AddSpecial(this_00,local_140);
      }
    }
    else {
      do {
        q = pcVar3;
        pcVar3 = q + 1;
        local_49 = q[1];
      } while ((""[(int)(uint)local_49] & 0x40) != 0);
      q = pcVar3;
      StringPiece::StringPiece(&local_120,pcVar4 + 1,(size_t)(pcVar3 + (-1 - (long)pcVar4)));
      EvalString::AddSpecial(this_00,local_120);
    }
  } while( true );
}

Assistant:

bool Lexer::ReadEvalString(EvalString* eval, bool path, string* err) {
  const char* p = ofs_;
  const char* q;
  const char* start;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	static const unsigned char yybm[] = {
		  0,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,   0,  16,  16,   0,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 32,  16,  16,  16,   0,  16,  16,  16, 
		 16,  16,  16,  16,  16, 208, 144,  16, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208,   0,  16,  16,  16,  16,  16, 
		 16, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208,  16,  16,  16,  16, 208, 
		 16, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208, 208, 208, 208, 208, 208, 
		208, 208, 208,  16,   0,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
		 16,  16,  16,  16,  16,  16,  16,  16, 
	};
	yych = *p;
	if (yybm[0+yych] & 16) {
		goto yy102;
	}
	if (yych <= '\r') {
		if (yych <= 0x00) goto yy100;
		if (yych <= '\n') goto yy105;
		goto yy107;
	} else {
		if (yych <= ' ') goto yy105;
		if (yych <= '$') goto yy109;
		goto yy105;
	}
yy100:
	++p;
	{
      last_token_ = start;
      return Error("unexpected EOF", err);
    }
yy102:
	yych = *++p;
	if (yybm[0+yych] & 16) {
		goto yy102;
	}
	{
      eval->AddText(StringPiece(start, p - start));
      continue;
    }
yy105:
	++p;
	{
      if (path) {
        p = start;
        break;
      } else {
        if (*start == '\n')
          break;
        eval->AddText(StringPiece(start, 1));
        continue;
      }
    }
yy107:
	yych = *++p;
	if (yych == '\n') goto yy110;
	{
      last_token_ = start;
      return Error(DescribeLastError(), err);
    }
yy109:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy122;
	}
	if (yych <= ' ') {
		if (yych <= '\f') {
			if (yych == '\n') goto yy114;
			goto yy112;
		} else {
			if (yych <= '\r') goto yy117;
			if (yych <= 0x1F) goto yy112;
			goto yy118;
		}
	} else {
		if (yych <= '/') {
			if (yych == '$') goto yy120;
			goto yy112;
		} else {
			if (yych <= ':') goto yy125;
			if (yych <= '`') goto yy112;
			if (yych <= '{') goto yy127;
			goto yy112;
		}
	}
yy110:
	++p;
	{
      if (path)
        p = start;
      break;
    }
yy112:
	++p;
yy113:
	{
      last_token_ = start;
      return Error("bad $-escape (literal $ must be written as $$)", err);
    }
yy114:
	yych = *++p;
	if (yybm[0+yych] & 32) {
		goto yy114;
	}
	{
      continue;
    }
yy117:
	yych = *++p;
	if (yych == '\n') goto yy128;
	goto yy113;
yy118:
	++p;
	{
      eval->AddText(StringPiece(" ", 1));
      continue;
    }
yy120:
	++p;
	{
      eval->AddText(StringPiece("$", 1));
      continue;
    }
yy122:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy122;
	}
	{
      eval->AddSpecial(StringPiece(start + 1, p - start - 1));
      continue;
    }
yy125:
	++p;
	{
      eval->AddText(StringPiece(":", 1));
      continue;
    }
yy127:
	yych = *(q = ++p);
	if (yybm[0+yych] & 128) {
		goto yy131;
	}
	goto yy113;
yy128:
	yych = *++p;
	if (yych == ' ') goto yy128;
	{
      continue;
    }
yy131:
	yych = *++p;
	if (yybm[0+yych] & 128) {
		goto yy131;
	}
	if (yych == '}') goto yy134;
	p = q;
	goto yy113;
yy134:
	++p;
	{
      eval->AddSpecial(StringPiece(start + 2, p - start - 3));
      continue;
    }
}

  }
  last_token_ = start;
  ofs_ = p;
  if (path)
    EatWhitespace();
  // Non-path strings end in newlines, so there's no whitespace to eat.
  return true;
}